

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushMacroScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  value_type entryPointCommand;
  Snapshot originSnapshot;
  bool bVar1;
  cmState *this_00;
  reference ppcVar2;
  Snapshot local_38;
  PolicyMap *local_20;
  PolicyMap *pm_local;
  string *fileName_local;
  cmMakefile *this_local;
  
  local_20 = pm;
  pm_local = (PolicyMap *)fileName;
  fileName_local = (string *)this;
  this_00 = GetState(this);
  originSnapshot = this->StateSnapshot;
  ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                      (&this->ContextStack);
  entryPointCommand = *ppcVar2;
  ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                      (&this->ContextStack);
  cmState::CreateMacroCallSnapshot
            (&local_38,this_00,originSnapshot,&entryPointCommand->Name,(*ppcVar2)->Line,
             (string *)pm_local);
  (this->StateSnapshot).State = local_38.State;
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  bVar1 = cmState::Snapshot::IsValid(&this->StateSnapshot);
  if (!bVar1) {
    __assert_fail("this->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                  ,0x629,
                  "void cmMakefile::PushMacroScope(const std::string &, const cmPolicies::PolicyMap &)"
                 );
  }
  PushFunctionBlockerBarrier(this);
  PushPolicy(this,true,local_20);
  return;
}

Assistant:

void cmMakefile::PushMacroScope(std::string const& fileName,
                                const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot =
      this->GetState()->CreateMacroCallSnapshot(
        this->StateSnapshot,
        this->ContextStack.back()->Name, this->ContextStack.back()->Line,
        fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}